

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2BufferSharingTest::renderResource
          (GLES2BufferSharingTest *this,Surface *screen,Surface *reference)

{
  int iVar1;
  byte bVar2;
  GLsizei GVar3;
  GLsizei GVar4;
  glReadPixelsFunc p_Var5;
  pointer puVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  short sVar9;
  GLenum GVar10;
  GLuint GVar11;
  GLuint GVar12;
  TestError *pTVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int x;
  int iVar19;
  int i;
  uint uVar20;
  undefined2 uVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float xf;
  float fVar33;
  float fVar34;
  float fVar35;
  allocator<char> local_279;
  undefined8 local_278;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  GLES2BufferSharingTest *local_260;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<float,_std::allocator<float>_> coords;
  IVec4 local_1e8;
  float local_1d0 [8];
  pointer local_1b0;
  ShaderProgram program;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&indices,
             "attribute mediump vec2 a_pos;\nattribute mediump float a_color;\nvarying mediump float v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&coords,
             "varying mediump float v_color;\nvoid main(void)\n{\n\tgl_FragColor = vec4(v_color, v_color, v_color, 1.0);\n}\n"
             ,&local_279);
  glu::makeVtxFragSources((ProgramSources *)local_1d0,(string *)&indices,(string *)&coords);
  glu::ShaderProgram::ShaderProgram
            (&program,&(this->super_GLES2SharingTest).m_gl,(ProgramSources *)local_1d0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1d0);
  std::__cxx11::string::~string((string *)&coords);
  std::__cxx11::string::~string((string *)&indices);
  if (program.m_program.m_info.linkOk == false) {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x168);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_278 = 0;
  local_260 = this;
  for (uVar20 = 0;
      (int)uVar20 <
      (*(int *)&(this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
      *(int *)&(this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start) / 4; uVar20 = uVar20 + 1) {
    uVar21 = (undefined2)local_278;
    local_1d0[0]._0_2_ = uVar21;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&indices,(unsigned_short *)local_1d0);
    local_1d0[0]._0_2_ = uVar21 + A;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&indices,(unsigned_short *)local_1d0);
    local_1d0[0]._0_2_ = uVar21 + I;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&indices,(unsigned_short *)local_1d0);
    local_1d0[0]._0_2_ = uVar21 + I;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&indices,(unsigned_short *)local_1d0);
    sVar9 = (short)local_278;
    local_1d0[0]._0_2_ = sVar9 + L;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&indices,(unsigned_short *)local_1d0);
    local_1d0[0] = (float)CONCAT22(local_1d0[0]._2_2_,sVar9);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (&indices,(unsigned_short *)local_1d0);
    fVar25 = (float)(uVar20 & 0xf) * 0.125 + -1.0;
    local_1d0[0] = fVar25;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,local_1d0);
    fVar24 = (float)(int)((float)(int)uVar20 * 0.0625) * 0.125 + -1.0;
    local_1d0[0] = fVar24;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,local_1d0);
    local_1d0[0] = fVar25;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,local_1d0);
    fVar26 = (float)((int)((float)(int)uVar20 * 0.0625) + 1) * 0.125 + -1.0;
    local_1d0[0] = fVar26;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,local_1d0);
    fVar25 = (float)((uVar20 & 0xf) + 1) * 0.125 + -1.0;
    local_1d0[0] = fVar25;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,local_1d0);
    local_1d0[0] = fVar26;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,local_1d0);
    this = local_260;
    local_1d0[0] = fVar25;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,local_1d0);
    local_1d0[0] = fVar24;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&coords,local_1d0);
    local_278 = (ulong)((int)local_278 + 4);
  }
  if (screen == (Surface *)0x0) {
    local_278._0_4_ = 0xf0;
    local_278._4_4_ = 0xf0;
  }
  else {
    local_278._0_4_ = screen->m_width;
    local_278._4_4_ = screen->m_height;
  }
  uStack_270 = 0;
  uStack_26c = 0;
  (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,(uint)local_278,local_278._4_4_);
  GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar10,"viewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x18e);
  (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
  GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar10,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,400);
  (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
  GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar10,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x191);
  (*(this->super_GLES2SharingTest).m_gl.useProgram)(program.m_program.m_program);
  GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar10,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x193);
  GVar11 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                     (program.m_program.m_program,"a_pos");
  GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar10,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x196);
  if (GVar11 != 0xffffffff) {
    GVar12 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                       (program.m_program.m_program,"a_color");
    GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar10,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x19a);
    if (GVar12 != 0xffffffff) {
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar12);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,"enableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x19d);
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar11);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,"enableVertexAttribArray(gridLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x19e);
      (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,this->m_glBuffer);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,"bindBuffer(GL_ARRAY_BUFFER, m_glBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a0);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar12,1,0x1401,'\x01',0,(void *)0x0);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,
                      "vertexAttribPointer(colorLocation, 1, GL_UNSIGNED_BYTE, GL_TRUE, 0, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a1);
      (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,0);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a2);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar11,2,0x1406,'\0',0,
                 coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,
                      "vertexAttribPointer(gridLocation, 2, GL_FLOAT, GL_FALSE, 0, &(coords[0]))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a4);
      (*(this->super_GLES2SharingTest).m_gl.drawElements)
                (4,(GLsizei)((ulong)((long)indices.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)indices.
                                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 1),0x1403,
                 indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                 .super__Vector_impl_data._M_start);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,
                      "drawElements(GL_TRIANGLES, (GLsizei)indices.size(), GL_UNSIGNED_SHORT, &(indices[0]))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a6);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar12);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,"disableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a7);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar11);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,"disableVertexAttribArray(gridLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a8);
      (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
      GVar10 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar10,"useProgram(0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1aa);
      if (screen != (Surface *)0x0) {
        tcu::Surface::getAccess((PixelBufferAccess *)local_1d0,reference);
        local_1e8.m_data[0] = 0xff;
        local_1e8.m_data[1] = 0;
        local_1e8.m_data[2] = 0;
        local_1e8.m_data[3] = 0xff;
        tcu::clear((PixelBufferAccess *)local_1d0,&local_1e8);
        p_Var5 = (this->super_GLES2SharingTest).m_gl.readPixels;
        GVar3 = screen->m_width;
        GVar4 = screen->m_height;
        tcu::Surface::getAccess((PixelBufferAccess *)local_1d0,screen);
        (*p_Var5)(0,0,GVar3,GVar4,0x1908,0x1401,local_1b0);
        puVar6 = (local_260->m_buffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar20 = (*(int *)&(local_260->m_buffer).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (int)puVar6) / 4;
        fVar24 = (float)(int)(uint)local_278;
        fVar26 = (float)local_278._4_4_;
        uVar22 = -(uint)(fVar24 * 0.5 < 0.0);
        uVar23 = -(uint)(fVar26 * 0.5 < 0.0);
        fVar25 = (float)(int)((float)(uVar22 & 0xbf000000 | ~uVar22 & 0x3f000000) + fVar24 * 0.5);
        fVar27 = (float)(int)((float)(uVar23 & 0xbf000000 | ~uVar23 & 0x3f000000) + fVar26 * 0.5);
        if ((int)uVar20 < 1) {
          uVar20 = 0;
        }
        for (uVar22 = 0; local_278._0_4_ = uVar20, uVar22 != uVar20; uVar22 = uVar22 + 1) {
          iVar14 = (uVar22 & 0xf) + 1;
          fVar28 = ((float)((int)((float)(int)uVar22 * 0.0625) + 1) * 0.125 + -1.0) * fVar26 * 0.5 +
                   fVar27;
          fVar29 = ((float)iVar14 * 0.125 + -1.0) * fVar24 * 0.5 + fVar25;
          fVar30 = ((float)(int)((float)(int)uVar22 * 0.0625) * 0.125 + -1.0) * fVar26 * 0.5 +
                   fVar27;
          fVar31 = ((float)(uVar22 & 0xf) * 0.125 + -1.0) * fVar24 * 0.5 + fVar25;
          auVar8._4_4_ = -(uint)(fVar29 < 0.0);
          auVar8._0_4_ = -(uint)(fVar28 < 0.0);
          auVar8._8_4_ = -(uint)(fVar30 < 0.0);
          auVar8._12_4_ = -(uint)(fVar31 < 0.0);
          uVar23 = movmskps(iVar14,auVar8);
          fVar32 = -0.5;
          if ((uVar23 & 8) == 0) {
            fVar32 = 0.5;
          }
          fVar33 = -0.5;
          if ((uVar23 & 4) == 0) {
            fVar33 = 0.5;
          }
          fVar34 = -0.5;
          if ((uVar23 & 2) == 0) {
            fVar34 = 0.5;
          }
          fVar35 = -0.5;
          if ((uVar23 & 1) == 0) {
            fVar35 = 0.5;
          }
          iVar15 = (int)(fVar31 + fVar32);
          iVar16 = (int)(fVar30 + fVar33);
          iVar17 = (int)(fVar29 + fVar34);
          iVar18 = (int)(fVar35 + fVar28);
          for (iVar14 = iVar15; iVar14 < iVar17; iVar14 = iVar14 + 1) {
            fVar28 = ((float)(iVar14 - iVar15) + 0.5) / (float)(iVar17 - iVar15);
            for (iVar19 = 0; iVar1 = iVar16 + iVar19, iVar1 < iVar18; iVar19 = iVar19 + 1) {
              fVar30 = ((float)iVar19 + 0.5) / (float)(iVar18 - iVar16);
              bVar7 = fVar30 < fVar28;
              fVar29 = 1.0 - fVar28;
              if (!bVar7) {
                fVar30 = 1.0 - fVar30;
                fVar29 = fVar28;
              }
              uVar23 = (uint)bVar7 * 2 | uVar22 * 4;
              bVar2 = puVar6[(int)(uVar23 | 1)];
              *(uint *)((long)(reference->m_pixels).m_ptr +
                       (long)(iVar1 * reference->m_width + iVar14) * 4) =
                   ((int)((float)(int)((uint)puVar6[(int)uVar23] - (uint)bVar2) * fVar30 +
                         (float)(int)((uint)puVar6[(int)(uVar22 * 4 + (uint)!bVar7 * 2)] -
                                     (uint)bVar2) * fVar29 + (float)bVar2) & 0xffU) * 0x10101 |
                   0xff000000;
            }
          }
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&coords.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      glu::ShaderProgram::~ShaderProgram(&program);
      return;
    }
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,(char *)0x0,"colorLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x19b);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar13,(char *)0x0,"gridLocation != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x197);
  __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2BufferSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump float a_color;\n"
	"varying mediump float v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump float v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = vec4(v_color, v_color, v_color, 1.0);\n"
	"}\n";

	glu::ShaderProgram program(m_gl, glu::makeVtxFragSources(vertexShader, fragmentShader));

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	std::vector<deUint16>	indices;
	std::vector<float>		coords;

	DE_ASSERT(m_buffer.size() % 4 == 0);

	for (int i = 0; i < (int)m_buffer.size() / 4; i++)
	{
		indices.push_back((deUint16)(i*4));
		indices.push_back((deUint16)(i*4 + 1));
		indices.push_back((deUint16)(i*4 + 2));
		indices.push_back((deUint16)(i*4 + 2));
		indices.push_back((deUint16)(i*4 + 3));
		indices.push_back((deUint16)(i*4));

		coords.push_back(0.125f * (float)(i % 16) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f)) - 1.0f);

		coords.push_back(0.125f * (float)(i % 16) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f);

		coords.push_back(0.125f * (float)((i % 16) + 1) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f);

		coords.push_back(0.125f * (float)((i % 16) + 1) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f)) - 1.0f);
	}

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	GLuint gridLocation = m_gl.getAttribLocation(program.getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(gridLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(program.getProgram(), "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(gridLocation));

	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_glBuffer));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 1, GL_UNSIGNED_BYTE, GL_TRUE, 0, DE_NULL));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, 0));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(gridLocation, 2, GL_FLOAT, GL_FALSE, 0, &(coords[0])));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, (GLsizei)indices.size(), GL_UNSIGNED_SHORT, &(indices[0])));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(gridLocation));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());
		for (int i = 0; i < (int)m_buffer.size() / 4; i++)
		{
			float fx1 = 0.125f * (float)(i % 16) - 1.0f;
			float fy1 = 0.125f * (float)((int)((float)i / 16.0f)) - 1.0f;
			float fx2 = 0.125f * (float)((i % 16) + 1) - 1.0f;
			float fy2 = 0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f;

			int ox = deRoundFloatToInt32((float)width	/ 2.0f);
			int oy = deRoundFloatToInt32((float)height	/ 2.0f);
			int x1 = deRoundFloatToInt32(((float)width	 * fx1 / 2.0f) + (float)ox);
			int y1 = deRoundFloatToInt32(((float)height	 * fy1 / 2.0f) + (float)oy);
			int x2 = deRoundFloatToInt32(((float)width	 * fx2 / 2.0f) + (float)ox);
			int y2 = deRoundFloatToInt32(((float)height	 * fy2 / 2.0f) + (float)oy);

			for (int x = x1; x < x2; x++)
			{
				for (int y = y1; y < y2; y++)
				{
					float		xf		= ((float)(x-x1) + 0.5f) / (float)(x2 - x1);
					float		yf		= ((float)(y-y1) + 0.5f) / (float)(y2 - y1);
					bool		tri		= yf >= xf;
					deUint8		a		= m_buffer[i*4 + (tri ? 1 : 3)];
					deUint8		b		= m_buffer[i*4 + (tri ? 2 : 0)];
					deUint8		c		= m_buffer[i*4 + (tri ? 0 : 2)];
					float		s		= tri ? xf : 1.0f-xf;
					float		t		= tri ? 1.0f-yf : yf;
					float		val		= (float)a + (float)(b-a)*s + (float)(c-a)*t;

					reference->setPixel(x, y, tcu::RGBA((deUint8)val, (deUint8)val, (deUint8)val, 255));
				}
			}
		}
	}
}